

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::encode_arith_init(symbol_codec *this)

{
  bool bVar1;
  output_symbol *in_RDI;
  output_symbol sym;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = vector<lzham::symbol_codec::output_symbol>::try_push_back
                    ((vector<lzham::symbol_codec::output_symbol> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI);
  return bVar1;
}

Assistant:

bool symbol_codec::encode_arith_init()
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      output_symbol sym;
      sym.m_bits = 0;
      sym.m_num_bits = output_symbol::cArithInit;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }